

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

string * __thiscall cmGeneratorTarget::GetLocation(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  string local_38;
  
  if (GetLocation(std::__cxx11::string_const&)::location_abi_cxx11_ == '\0') {
    GetLocation();
  }
  bVar1 = cmTarget::IsImported(this->Target);
  if (bVar1) {
    cmTarget::ImportedGetFullPath(&local_38,this->Target,config,RuntimeBinaryArtifact);
    std::__cxx11::string::operator=
              ((string *)&GetLocation(std::__cxx11::string_const&)::location_abi_cxx11_,
               (string *)&local_38);
  }
  else {
    GetFullPath(&local_38,this,config,RuntimeBinaryArtifact,false);
    std::__cxx11::string::operator=
              ((string *)&GetLocation(std::__cxx11::string_const&)::location_abi_cxx11_,
               (string *)&local_38);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return &GetLocation(std::__cxx11::string_const&)::location_abi_cxx11_;
}

Assistant:

const std::string& cmGeneratorTarget::GetLocation(
  const std::string& config) const
{
  static std::string location;
  if (this->IsImported()) {
    location = this->Target->ImportedGetFullPath(
      config, cmStateEnums::RuntimeBinaryArtifact);
  } else {
    location = this->GetFullPath(config, cmStateEnums::RuntimeBinaryArtifact);
  }
  return location;
}